

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-model-base-flex-estimation.hxx
# Opt level: O3

IndexedVectorArray *
stateObservation::examples::offlineModelBaseFlexEstimation
          (IndexedVectorArray *__return_storage_ptr__,IndexedVectorArray *y,IndexedVectorArray *u,
          Matrix *xh0,IndexedVectorArray *numberOfContacts,double dt,double mass,bool withForce,
          IndexedMatrixArray *Q,IndexedMatrixArray *R,Matrix3 *kfe,Matrix3 *kfv,Matrix3 *kte,
          Matrix3 *ktv,IndexedVectorArray *prediction,IndexedVectorArray *ino,
          IndexedVectorArray *premea,IndexedVectorArray *simumea,int verbose)

{
  double dVar1;
  _Map_pointer ppMVar2;
  _Map_pointer ppMVar3;
  _Map_pointer ppMVar4;
  _Map_pointer ppMVar5;
  _Elt_pointer pMVar6;
  DenseStorage<double,__1,__1,__1,_0> *pDVar7;
  _Map_pointer ppMVar8;
  long lVar9;
  ostream *poVar10;
  DenseStorage<double,__1,__1,_1,_0> *pDVar11;
  char *__function;
  long lVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  IndexedVectorArray *xh;
  ModelBaseEKFFlexEstimatorIMU estimator;
  long local_17f8;
  Matrix<double,__1,_1,_0,__1,_1> local_17f0;
  IndexedVectorArray *local_17e0;
  double local_17d8;
  DenseStorage<double,__1,__1,__1,_0> local_17d0;
  DenseStorage<double,__1,__1,_1,_0> *local_17b8;
  undefined8 local_17b0;
  long local_17a0;
  double local_1798;
  IndexedVectorArray *local_1790;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_1788;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_1780;
  Deque *local_1778;
  DenseStorage<double,__1,__1,_1,_0> local_1770;
  long local_1760;
  ModelBaseEKFFlexEstimatorIMU local_1758 [5928];
  
  local_17e0 = numberOfContacts;
  local_17d8 = dt;
  local_1798 = mass;
  local_1790 = __return_storage_ptr__;
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ModelBaseEKFFlexEstimatorIMU(local_1758,0.005);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactModel
            ((uint)local_1758);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod
            (local_17d8);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setRobotMass(local_1798);
  local_1780 = &(Q->v_).
                super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Deque_impl_data._M_start;
  ppMVar8 = (Q->v_).
            super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(Q->v_).
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(Q->v_).
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
      ((long)(Q->v_).
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(Q->v_).
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
      (((long)ppMVar8 -
        (long)(Q->v_).
              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(ppMVar8 == (_Map_pointer)0x0)) * 0x15 == 1) {
    pDVar7 = (DenseStorage<double,__1,__1,__1,_0> *)
             std::
             _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
             ::operator[](local_1780,0);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_17d0,pDVar7);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setProcessNoiseCovariance
              ((Matrix *)local_1758);
    free(local_17d0.m_data);
  }
  ppMVar8 = (R->v_).
            super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar14 = (long)ppMVar8 -
           (long)(R->v_).
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node >> 3;
  local_1788 = &(R->v_).
                super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Deque_impl_data._M_start;
  local_17d8 = (double)(((long)(R->v_).
                               super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(R->v_).
                               super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                       -0x5555555555555555);
  lVar12 = ((long)(R->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)(R->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555;
  if ((lVar14 + -1 + (ulong)(ppMVar8 == (_Map_pointer)0x0)) * 0x15 + (long)local_17d8 + lVar12 == 1)
  {
    pDVar7 = (DenseStorage<double,__1,__1,__1,_0> *)
             std::
             _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
             ::operator[](local_1788,0);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_17d0,pDVar7);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
    setMeasurementNoiseCovariance((Matrix *)local_1758);
    free(local_17d0.m_data);
    ppMVar8 = (R->v_).
              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar14 = (long)ppMVar8 -
             (long)(R->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node >> 3;
    local_17d8 = (double)(((long)(R->v_).
                                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)(R->v_).
                                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                         -0x5555555555555555);
    lVar12 = ((long)(R->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(R->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555;
  }
  ppMVar2 = (Q->v_).
            super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppMVar3 = (Q->v_).
            super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_1760 = (long)(Q->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)(Q->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_1798 = (double)((long)(Q->v_).
                              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)(Q->v_).
                             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setFlexibilityGuess
            ((Matrix *)local_1758);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces
            (SUB81(local_1758,0));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithForcesMeasurements
            (SUB81(local_1758,0));
  auVar17._8_8_ =
       -(ulong)((kfe->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[5] != 0.0);
  auVar17._0_8_ =
       -(ulong)((kfe->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[4] != 0.0);
  auVar18._8_8_ =
       -(ulong)((kfe->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[7] != 0.0);
  auVar18._0_8_ =
       -(ulong)((kfe->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6] != 0.0);
  auVar18 = packssdw(auVar17,auVar18);
  auVar15._8_8_ =
       -(ulong)((kfe->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[1] != 0.0);
  auVar15._0_8_ =
       -(ulong)((kfe->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0] != 0.0);
  auVar16._8_8_ =
       -(ulong)((kfe->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3] != 0.0);
  auVar16._0_8_ =
       -(ulong)((kfe->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[2] != 0.0);
  auVar16 = packssdw(auVar15,auVar16);
  auVar16 = packssdw(auVar16,auVar18);
  if ((((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar16 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar16 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar16 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar16 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar16 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar16 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar16 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar16 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar16 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar16 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar16 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar16[0xf] < '\0')
      || (dVar1 = (kfe->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8], dVar1 != 0.0)) || (NAN(dVar1))) {
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfe
              ((Matrix *)local_1758);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfv
              ((Matrix *)local_1758);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKte
              ((Matrix *)local_1758);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKtv
              ((Matrix *)local_1758);
  }
  local_1778 = &local_1790->v_;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1790->k_ = 0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::_M_initialize_map(&local_1778->
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ,0);
  lVar9 = y->k_;
  if (0 < lVar9) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_17d0,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)xh0);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue(local_1790,(Matrix<double,__1,_1,_0,__1,_1> *)&local_17d0,y->k_ + -1);
    free(local_17d0.m_data);
    lVar9 = y->k_;
  }
  local_1798 = (double)(((long)local_1798 >> 3) * -0x5555555555555555 +
                        (local_1760 >> 3) * -0x5555555555555555 +
                       (((long)ppMVar2 - (long)ppMVar3 >> 3) + -1 +
                       (ulong)(ppMVar2 == (_Map_pointer)0x0)) * 0x15);
  local_17d8 = (double)((long)local_17d8 + lVar12 +
                       (lVar14 + -1 + (ulong)(ppMVar8 == (_Map_pointer)0x0)) * 0x15);
  local_17f8 = lVar9 << 4;
  lVar12 = lVar9;
  while( true ) {
    ppMVar4 = (y->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    if ((long)(((long)(y->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(y->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)(y->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(y->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) + lVar9 +
              ((((ulong)((long)ppMVar4 -
                        (long)(y->v_).
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(ppMVar4 == (_Map_pointer)0x0)) * 0x20) <= lVar12) {
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
      ~ModelBaseEKFFlexEstimatorIMU(local_1758);
      return local_1790;
    }
    ppMVar4 = (local_17e0->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppMVar5 = (local_17e0->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pMVar6 = (local_17e0->v_).
             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar14 = ((long)(local_17e0->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar6 >> 4) +
             ((long)(local_17e0->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(local_17e0->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)ppMVar4 - (long)ppMVar5) >> 3) - 1) +
             (ulong)(ppMVar4 == (_Map_pointer)0x0)) * 0x20;
    if (((lVar14 == 0) || (lVar9 = local_17e0->k_, lVar12 < lVar9)) || (lVar14 + lVar9 <= lVar12))
    break;
    lVar14 = ((long)pMVar6 -
              (long)(local_17e0->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
    uVar13 = lVar12 + lVar14;
    if ((long)uVar13 < 0) {
      uVar13 = (long)uVar13 >> 5;
LAB_00103cc7:
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                (ppMVar5[uVar13] + lVar14 + uVar13 * -0x20 + lVar12);
    }
    else {
      if (0x1f < uVar13) {
        uVar13 = uVar13 >> 5;
        goto LAB_00103cc7;
      }
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                ((long)&pMVar6[-lVar9].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + local_17f8);
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d0,pDVar11);
    if (local_17d0.m_rows < 1) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    round(*local_17d0.m_data);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactsNumber
              ((uint)local_1758);
    free(local_17d0.m_data);
    if ((0 < verbose) && ((verbose != 1 || (lVar12 == (lVar12 / 1000) * 1000)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iteration: ",0xb);
      poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if (2 < (uint)verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"number of contacts: ",0x14);
        ppMVar4 = (local_17e0->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppMVar5 = (local_17e0->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        pMVar6 = (local_17e0->v_).
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar14 = ((long)(local_17e0->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar6 >> 4) +
                 ((long)(local_17e0->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(local_17e0->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                 ((((ulong)((long)ppMVar4 - (long)ppMVar5) >> 3) - 1) +
                 (ulong)(ppMVar4 == (_Map_pointer)0x0)) * 0x20;
        if (((lVar14 == 0) || (lVar9 = local_17e0->k_, lVar12 < lVar9)) ||
           (lVar14 + lVar9 <= lVar12)) break;
        lVar14 = ((long)pMVar6 -
                  (long)(local_17e0->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
        uVar13 = lVar12 + lVar14;
        if ((long)uVar13 < 0) {
          uVar13 = (long)uVar13 >> 5;
LAB_00103e82:
          pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                    (ppMVar5[uVar13] + lVar14 + uVar13 * -0x20 + lVar12);
        }
        else {
          if (0x1f < uVar13) {
            uVar13 = uVar13 >> 5;
            goto LAB_00103e82;
          }
          pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                    ((long)&pMVar6[-lVar9].
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_data + local_17f8);
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d0,pDVar11);
        poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                    (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                    &local_17d0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        free(local_17d0.m_data);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"size of the measurement: ",0x19);
        ppMVar4 = (y->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppMVar5 = (y->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        pMVar6 = (y->v_).
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar14 = ((long)(y->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar6 >> 4) +
                 ((long)(y->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(y->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                 ((((ulong)((long)ppMVar4 - (long)ppMVar5) >> 3) - 1) +
                 (ulong)(ppMVar4 == (_Map_pointer)0x0)) * 0x20;
        if (((lVar14 == 0) || (lVar9 = y->k_, lVar12 < lVar9)) || (lVar14 + lVar9 <= lVar12)) break;
        lVar14 = ((long)pMVar6 -
                  (long)(y->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
        uVar13 = lVar12 + lVar14;
        if ((long)uVar13 < 0) {
          uVar13 = (long)uVar13 >> 5;
LAB_00103f9b:
          pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                    (ppMVar5[uVar13] + lVar14 + uVar13 * -0x20 + lVar12);
        }
        else {
          if (0x1f < uVar13) {
            uVar13 = uVar13 >> 5;
            goto LAB_00103f9b;
          }
          pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                    ((long)&pMVar6[-lVar9].
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_data + local_17f8);
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d0,pDVar11);
        poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,", supposed to be ",0x11);
        stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getMeasurementSize();
        poVar10 = std::ostream::_M_insert<long>((long)poVar10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        free(local_17d0.m_data);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"size of the input: ",0x13);
        ppMVar4 = (u->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppMVar5 = (u->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        pMVar6 = (u->v_).
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar14 = ((long)(u->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar6 >> 4) +
                 ((long)(u->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(u->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                 ((((ulong)((long)ppMVar4 - (long)ppMVar5) >> 3) - 1) +
                 (ulong)(ppMVar4 == (_Map_pointer)0x0)) * 0x20;
        if (((lVar14 == 0) || (lVar9 = u->k_, lVar12 < lVar9)) || (lVar14 + lVar9 <= lVar12)) break;
        lVar14 = ((long)pMVar6 -
                  (long)(u->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
        uVar13 = lVar12 + lVar14;
        if ((long)uVar13 < 0) {
          uVar13 = (long)uVar13 >> 5;
LAB_001040da:
          pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                    (ppMVar5[uVar13] + lVar14 + uVar13 * -0x20 + lVar12);
        }
        else {
          if (0x1f < uVar13) {
            uVar13 = uVar13 >> 5;
            goto LAB_001040da;
          }
          pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                    ((long)&pMVar6[-lVar9].
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_data + local_17f8);
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d0,pDVar11);
        poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,", supposed to be ",0x11);
        stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getInputSize();
        poVar10 = std::ostream::_M_insert<long>((long)poVar10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        free(local_17d0.m_data);
        if (verbose != 3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"numberOfContacts: ",0x12);
          ppMVar4 = (local_17e0->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppMVar5 = (local_17e0->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          pMVar6 = (local_17e0->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          lVar14 = ((long)(local_17e0->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar6 >> 4) +
                   ((long)(local_17e0->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(local_17e0->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                   ((((ulong)((long)ppMVar4 - (long)ppMVar5) >> 3) - 1) +
                   (ulong)(ppMVar4 == (_Map_pointer)0x0)) * 0x20;
          if (((lVar14 == 0) || (lVar9 = local_17e0->k_, lVar12 < lVar9)) ||
             (lVar14 + lVar9 <= lVar12)) break;
          lVar14 = ((long)pMVar6 -
                    (long)(local_17e0->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
          uVar13 = lVar12 + lVar14;
          if ((long)uVar13 < 0) {
            uVar13 = (long)uVar13 >> 5;
LAB_00104239:
            pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                      (ppMVar5[uVar13] + lVar14 + uVar13 * -0x20 + lVar12);
          }
          else {
            if (0x1f < uVar13) {
              uVar13 = uVar13 >> 5;
              goto LAB_00104239;
            }
            pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                      ((long)&pMVar6[-lVar9].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + local_17f8);
          }
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d0,pDVar11);
          local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)&local_17d0;
          poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_17f0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          free(local_17d0.m_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Measurement: ",0xd);
          ppMVar4 = (y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppMVar5 = (y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          pMVar6 = (y->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          lVar14 = ((long)(y->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar6 >> 4) +
                   ((long)(y->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(y->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                   ((((ulong)((long)ppMVar4 - (long)ppMVar5) >> 3) - 1) +
                   (ulong)(ppMVar4 == (_Map_pointer)0x0)) * 0x20;
          if (((lVar14 == 0) || (lVar9 = y->k_, lVar12 < lVar9)) || (lVar14 + lVar9 <= lVar12))
          break;
          lVar14 = ((long)pMVar6 -
                    (long)(y->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
          uVar13 = lVar12 + lVar14;
          if ((long)uVar13 < 0) {
            uVar13 = (long)uVar13 >> 5;
LAB_00104359:
            pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                      (ppMVar5[uVar13] + lVar14 + uVar13 * -0x20 + lVar12);
          }
          else {
            if (0x1f < uVar13) {
              uVar13 = uVar13 >> 5;
              goto LAB_00104359;
            }
            pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                      ((long)&pMVar6[-lVar9].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + local_17f8);
          }
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d0,pDVar11);
          local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)&local_17d0;
          poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_17f0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          free(local_17d0.m_data);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input: ",7);
          ppMVar4 = (u->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppMVar5 = (u->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          pMVar6 = (u->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          lVar14 = ((long)(u->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar6 >> 4) +
                   ((long)(u->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(u->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                   ((((ulong)((long)ppMVar4 - (long)ppMVar5) >> 3) - 1) +
                   (ulong)(ppMVar4 == (_Map_pointer)0x0)) * 0x20;
          if (((lVar14 == 0) || (lVar9 = u->k_, lVar12 < lVar9)) || (lVar14 + lVar9 <= lVar12))
          break;
          lVar14 = ((long)pMVar6 -
                    (long)(u->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
          uVar13 = lVar12 + lVar14;
          if ((long)uVar13 < 0) {
            uVar13 = (long)uVar13 >> 5;
LAB_00104471:
            pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                      (ppMVar5[uVar13] + lVar14 + uVar13 * -0x20 + lVar12);
          }
          else {
            if (0x1f < uVar13) {
              uVar13 = uVar13 >> 5;
              goto LAB_00104471;
            }
            pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                      ((long)&pMVar6[-lVar9].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + local_17f8);
          }
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d0,pDVar11);
          local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)&local_17d0;
          poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_17f0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          free(local_17d0.m_data);
        }
      }
    }
    ppMVar4 = (y->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppMVar5 = (y->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pMVar6 = (y->v_).
             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar14 = ((long)(y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar6 >> 4) +
             ((long)(y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)ppMVar4 - (long)ppMVar5) >> 3) - 1) +
             (ulong)(ppMVar4 == (_Map_pointer)0x0)) * 0x20;
    if (((lVar14 == 0) || (lVar9 = y->k_, lVar12 < lVar9)) || (lVar14 + lVar9 <= lVar12)) break;
    lVar14 = ((long)pMVar6 -
              (long)(y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
    uVar13 = lVar12 + lVar14;
    if ((long)uVar13 < 0) {
      uVar13 = (long)uVar13 >> 5;
LAB_00104579:
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                (ppMVar5[uVar13] + lVar14 + uVar13 * -0x20 + lVar12);
    }
    else {
      if (0x1f < uVar13) {
        uVar13 = uVar13 >> 5;
        goto LAB_00104579;
      }
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                ((long)&pMVar6[-lVar9].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + local_17f8);
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1770,pDVar11);
    local_17d0.m_rows =
         stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getMeasurementSize()
    ;
    local_17d0.m_data = local_1770.m_data;
    if (local_17d0.m_rows < 0 && local_1770.m_data != (double *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                   );
    }
    local_17b8 = &local_1770;
    local_17b0 = 0;
    local_17a0 = local_1770.m_rows;
    if ((local_17d0.m_rows < 0) || (local_1770.m_rows < local_17d0.m_rows)) {
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_17f0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_17d0);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)local_1758);
    free(local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
    ;
    free(local_1770.m_data);
    ppMVar4 = (u->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppMVar5 = (u->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pMVar6 = (u->v_).
             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar14 = ((long)(u->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar6 >> 4) +
             ((long)(u->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(u->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)ppMVar4 - (long)ppMVar5) >> 3) - 1) +
             (ulong)(ppMVar4 == (_Map_pointer)0x0)) * 0x20;
    if (((lVar14 == 0) || (lVar9 = u->k_, lVar12 < lVar9)) || (lVar14 + lVar9 <= lVar12)) break;
    lVar14 = ((long)pMVar6 -
              (long)(u->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
    uVar13 = lVar12 + lVar14;
    if ((long)uVar13 < 0) {
      uVar13 = (long)uVar13 >> 5;
LAB_001046ce:
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                (ppMVar5[uVar13] + lVar14 + uVar13 * -0x20 + lVar12);
    }
    else {
      if (0x1f < uVar13) {
        uVar13 = uVar13 >> 5;
        goto LAB_001046ce;
      }
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                ((long)&pMVar6[-lVar9].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + local_17f8);
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d0,pDVar11);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)local_1758);
    free(local_17d0.m_data);
    if (1 < (long)local_1798) {
      ppMVar8 = (Q->v_).
                super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      lVar14 = ((long)(Q->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(Q->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
               ((long)(Q->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(Q->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555
               + (((long)ppMVar8 -
                   (long)(Q->v_).
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(ppMVar8 == (_Map_pointer)0x0)) * 0x15;
      if (((lVar14 != 0) && (lVar9 = Q->k_, lVar9 <= lVar12)) && (lVar12 < lVar14 + lVar9)) {
        pDVar7 = (DenseStorage<double,__1,__1,__1,_0> *)
                 std::
                 _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                 ::operator[](local_1780,lVar12 - lVar9);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_17d0,pDVar7);
        stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
        setProcessNoiseCovariance((Matrix *)local_1758);
        free(local_17d0.m_data);
        goto LAB_001047c9;
      }
LAB_00104a9f:
      __function = 
      "void stateObservation::IndexedMatrixArrayT<>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, -1>, Allocator = std::allocator<Eigen::Matrix<double, -1, -1>>]"
      ;
      goto LAB_00104ab4;
    }
LAB_001047c9:
    if (1 < (long)local_17d8) {
      ppMVar8 = (R->v_).
                super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      lVar14 = ((long)(R->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(R->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
               ((long)(R->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(R->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555
               + (((long)ppMVar8 -
                   (long)(R->v_).
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(ppMVar8 == (_Map_pointer)0x0)) * 0x15;
      if (((lVar14 == 0) || (lVar9 = R->k_, lVar12 < lVar9)) || (lVar14 + lVar9 <= lVar12))
      goto LAB_00104a9f;
      pDVar7 = (DenseStorage<double,__1,__1,__1,_0> *)
               std::
               _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
               ::operator[](local_1788,lVar12 - lVar9);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_17d0,pDVar7);
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
      setMeasurementNoiseCovariance((Matrix *)local_1758);
      free(local_17d0.m_data);
    }
    pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
              stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
              getFlexibilityVector();
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d0,pDVar11);
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(local_1778,(value_type *)&local_17d0);
    if (prediction != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getLastPrediction();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(prediction,&local_17f0,lVar12);
      free(local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
    }
    if (ino != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInnovation();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(ino,&local_17f0,lVar12);
      free(local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
    }
    if (premea != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
      getLastPredictedMeasurement();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(premea,&local_17f0,lVar12);
      free(local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
    }
    if (simumea != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getSimulatedMeasurement
                ();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(simumea,&local_17f0,lVar12);
      free(local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
    }
    if (1 < verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Success",7);
      if (verbose != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", rebuilt state ",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)&local_17d0;
        Eigen::operator<<((ostream *)&std::cout,
                          (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                          &local_17f0);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
    }
    free(local_17d0.m_data);
    lVar12 = lVar12 + 1;
    lVar9 = y->k_;
    local_17f8 = local_17f8 + 0x10;
  }
  __function = 
  "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
  ;
LAB_00104ab4:
  __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x192,__function);
}

Assistant:

stateObservation::IndexedVectorArray offlineModelBaseFlexEstimation(
  const stateObservation::IndexedVectorArray & y,
  const stateObservation::IndexedVectorArray & u,
  const Matrix & xh0,
  const stateObservation::IndexedVectorArray numberOfContacts,
  double dt,
  double mass,
  bool withForce,
  const stateObservation::IndexedMatrixArray & Q,
  const stateObservation::IndexedMatrixArray & R,
  const Matrix3 & kfe,
  const Matrix3 & kfv,
  const Matrix3 & kte,
  const Matrix3 & ktv,
  IndexedVectorArray * prediction,
  IndexedVectorArray * ino,
  IndexedVectorArray * premea,
  IndexedVectorArray * simumea,
  int verbose)
{


  flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU estimator;

  estimator.setContactModel(flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::contactModel::elasticContact);
  estimator.setSamplingPeriod(dt);
  estimator.setRobotMass(mass);

  bool customQ = false,
       customR = false;

  if (Q.size()==1)
  {
    estimator.setProcessNoiseCovariance(Q[Q.getFirstIndex()]);
  }
  if (R.size()==1)
  {
    estimator.setMeasurementNoiseCovariance(R[R.getFirstIndex()]);
  }

  if (Q.size()>1)
  {
    customQ=true;
  }
  if (R.size()>1)
  {
    customR=true;
  }



//  Matrix Ri,Qi,P;
//
//  int measurementSize=6;
//  int stateSize=flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::state::size;
//
//  double acceleroCovariance=acc_cov_const;
//  double gyroCovariance=gyr_cov_const;
//  double posStateCov=pos_state_cov_const;
//  double oristateCov=ori_state_cov_const;
//  double velStateCov=vel_state_cov_const;
//  double angvStateCov=angv_state_cov_const;
//  double stateForceCov=state_fc_const;



//  Ri.noalias()=Matrix::Identity(measurementSize,measurementSize)*acceleroCovariance;
//  Ri(3,3)=R(4,4)=R(5,5)=gyroCovariance;
//  Qi.noalias()=Matrix::Identity(stateSize,stateSize)*posStateCov;
//
//  Qi.diagonal().segment<3>(state::ori).setConstant(oristateCov);
//
//  Qi.diagonal().segment<3>(state::linVel).setConstant(velStateCov);
//  Qi.diagonal().segment<3>(state::angVel).setConstant(angvStateCov);
//  Qi.diagonal().segment<12>(state::fc).setConstant(stateForceCov);
//
//  estimator.setProcessNoiseCovariance(Qi);
//  estimator.setMeasurementNoiseCovariance(Ri);
//  Matrix forcevariance= Matrix::Identity(6,6)*force_sensor_const;
//  forcevariance.block(3,3,3,3)=Matrix::Identity(3,3)*torque_sensor_const;
//  /// consider the vertical torque as reliable as a force
//  forcevariance(2,2)=torque_sensor_const;
//  /// consider the vertical force as reliable as torque
//  forcevariance(6,6)=force_sensor_const;
//  estimator.setForceVariance(forcevariance);



  estimator.setFlexibilityGuess(xh0);

  estimator.setWithUnmodeledForces(true);


  estimator.setWithForcesMeasurements(withForce);


  if (kfe!=Matrix3::Zero())
  {
    estimator.setKfe(kfe);
    estimator.setKfv(kfv);
    estimator.setKte(kte);
    estimator.setKtv(ktv);
  }

  ///the array of the state estimations over time
  stateObservation::IndexedVectorArray xh;
  if (y.getFirstIndex()>0)
    xh.setValue(xh0,y.getFirstIndex()-1);

  ///the reconstruction of the state
  for (TimeIndex i=y.getFirstIndex(); i<y.getNextIndex(); ++i)
  {

    estimator.setContactsNumber(unsigned(round(numberOfContacts[i](0))));

    if (verbose>0)
    {
      if (i%1000==0 || verbose >1)
      {
        std::cout << "iteration: " << i  << std::endl ;

        if (verbose >2)
        {
          std::cout << "number of contacts: "<< numberOfContacts[i]<< std::endl;
          std::cout << "size of the measurement: "<< y[i].size()
                    << ", supposed to be " << estimator.getMeasurementSize() << std::endl;
          std::cout << "size of the input: "<< u[i].size()
                    << ", supposed to be " << estimator.getInputSize() << std::endl;

          if (verbose > 3)
          {
            std::cout << "numberOfContacts: " << numberOfContacts[i].transpose() << std::endl;
            std::cout << "Measurement: " << y[i].transpose() << std::endl;
            std::cout << "Input: " << u[i].transpose() << std::endl;
          }
        }
      }
    }

    ///introduction of the measurement
    estimator.setMeasurement(Vector(y[i]).head(estimator.getMeasurementSize()));

    estimator.setMeasurementInput(u[i]);

    ///initialize flexibility
    if (customQ)
    {
      estimator.setProcessNoiseCovariance(Q[i]);
    }

    if (customR)
    {
      estimator.setMeasurementNoiseCovariance(R[i]);
    }

    ///get the estimation and give it to the array
    Vector xhk=estimator.getFlexibilityVector();

    xh.pushBack(xhk);

    if (prediction != 0x0)
    {
      prediction->setValue(estimator.getLastPrediction(),i);
    }

    if (ino != 0x0)
    {
      ino->setValue(estimator.getInnovation(),i);
    }

    if (premea != 0x0)
    {
      premea->setValue(estimator.getLastPredictedMeasurement(),i);
    }

    if (simumea != 0x0)
    {
      simumea->setValue(estimator.getSimulatedMeasurement(),i);
    }

    if (verbose >1)
    {
      std::cout << "Success";
      if (verbose >2)
      {
        std::cout << ", rebuilt state "<<std::endl;
        std::cout << xhk.transpose();
      }

      std::cout<<std::endl;

    }

  }

  return xh;
}